

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenLoopSetBody(BinaryenExpressionRef expr,BinaryenExpressionRef bodyExpr)

{
  bool bVar1;
  Expression *expression;
  BinaryenExpressionRef bodyExpr_local;
  BinaryenExpressionRef expr_local;
  
  bVar1 = wasm::Expression::is<wasm::Loop>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Loop>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x835,"void BinaryenLoopSetBody(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (bodyExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = bodyExpr;
    return;
  }
  __assert_fail("bodyExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x836,"void BinaryenLoopSetBody(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenLoopSetBody(BinaryenExpressionRef expr,
                         BinaryenExpressionRef bodyExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Loop>());
  assert(bodyExpr);
  static_cast<Loop*>(expression)->body = (Expression*)bodyExpr;
}